

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_version.cc
# Opt level: O1

void rbdl_check_api_version(int version)

{
  ostream *poVar1;
  uint uVar2;
  uint uVar3;
  ostringstream link_version_string;
  ostringstream compile_version_string;
  long *local_360;
  long local_358;
  long local_350 [2];
  long *local_340;
  long local_338;
  long local_330 [2];
  long *local_320 [2];
  long local_310 [12];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"");
  std::__cxx11::ostringstream::ostringstream(local_1a8,(string *)local_320,_S_out);
  if (local_320[0] != local_310) {
    operator_delete(local_320[0],local_310[0] + 1);
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  std::ostream::operator<<((ostream *)poVar1,1);
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320,(string *)&local_360,_S_out)
  ;
  uVar2 = (uint)version >> 0x10 & 0xff;
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_320,uVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  uVar3 = (uint)version >> 8 & 0xff;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,uVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  std::ostream::operator<<((ostream *)poVar1,version & 0xff);
  if (uVar2 == 3) {
    if (uVar3 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Warning: RBDL library is of version ",0x24);
      std::__cxx11::stringbuf::str();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_360,local_358);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1," but rbdl_config.h is from version ",0x23);
      std::__cxx11::stringbuf::str();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(char *)local_340,local_338);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if (local_340 != local_330) {
        operator_delete(local_340,local_330[0] + 1);
      }
      if (local_360 != local_350) {
        operator_delete(local_360,local_350[0] + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: trying to link against an incompatible RBDL library.",
             0x3b);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"The library version is: ",0x18);
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_360,local_358);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," but rbdl_config.h is version ",0x1e);
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_340,local_338);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  abort();
}

Assistant:

RBDL_DLLAPI void rbdl_check_api_version(int version) {
  int compile_version = rbdl_get_api_version();

  int compile_major = (compile_version & 0xff0000) >> 16;
  int compile_minor = (compile_version & 0x00ff00) >> 8;
  int compile_patch = (compile_version & 0x0000ff);

  std::ostringstream compile_version_string("");
  compile_version_string << compile_major << "." << compile_minor << "."
    << compile_patch;

  int version_major = (version & 0xff0000) >> 16;
  int version_minor = (version & 0x00ff00) >> 8;
  int version_patch = (version & 0x0000ff);

  std::ostringstream link_version_string ("");
  link_version_string << version_major << "." << version_minor << "."
    << version_patch;

  if (version_major != compile_major) {
    std::cerr << "Error: trying to link against an incompatible RBDL library."
      << std::endl;
    std::cerr << "The library version is: " << compile_version_string.str()
      << " but rbdl_config.h is version " << link_version_string.str()
      << std::endl;
    abort();
  } else if (version_minor != compile_minor) {
    std::cout << "Warning: RBDL library is of version "
      << compile_version_string.str() << " but rbdl_config.h is from version "
      << link_version_string.str() << std::endl;
  }
}